

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture3DProjBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float *pfVar8;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar8 = tcu::Vector<float,_4>::x(c->in);
  fVar1 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar2 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  fVar3 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar4 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  fVar5 = *pfVar8;
  pfVar8 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar6 = *pfVar8;
  fVar7 = local_18->lod;
  pfVar8 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  texture3D((Functional *)&local_48,c,fVar1 / fVar2,fVar3 / fVar4,fVar5 / fVar6,fVar7 + *pfVar8);
  tcu::operator*((tcu *)&local_38,&local_48,&local_18->scale);
  tcu::operator+((tcu *)&local_28,&local_38,&local_18->bias);
  *(undefined8 *)p_local[10].scale.m_data = local_28;
  *(undefined8 *)(p_local[10].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture3DProjBias	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), p.lod+c.in[1].x())*p.scale + p.bias; }